

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

bool absl::lts_20240722::container_internal::operator==(const_iterator *a,const_iterator *b)

{
  bool bVar1;
  const_iterator *b_local;
  const_iterator *a_local;
  
  bVar1 = operator==(&a->inner_,&b->inner_);
  return bVar1;
}

Assistant:

bool operator==(const const_iterator& a, const const_iterator& b) {
      return a.inner_ == b.inner_;
    }